

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
atoiTest_testInvalidChars_Test::~atoiTest_testInvalidChars_Test
          (atoiTest_testInvalidChars_Test *this)

{
  atoiTest_testInvalidChars_Test *this_local;
  
  ~atoiTest_testInvalidChars_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(atoiTest, testInvalidChars) {
  test<int64_t>(false, ""); 
  test<int64_t>(false, " "); 
  test<int64_t>(false, "  "); 
  test<int64_t>(false, "1a"); 
  test<int64_t>(false, "11234b"); 
  test<int64_t>(false, "1 "); 
  test<int64_t>(false, "1234 "); 
  test<int64_t>(false, "-"); 
  test<int64_t>(false, "+"); 
  test<int64_t>(false, "- "); 
  test<int64_t>(false, "+ "); 
  test<int64_t>(false, "-11234a"); 
  test<int64_t>(false, "-11234 "); 
  test<int64_t>(false, "o"); 
  test<int64_t>(false, "ooooo"); 
  test<int64_t>(false, "1A2B3C"); 
  test<int64_t>(false, "aaaaa14453"); 
  test<int64_t>(false, "02a"); 
}